

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

optional<CKey> * __thiscall
wallet::CWallet::GetKey(optional<CKey> *__return_storage_ptr__,CWallet *this,CKeyID *keyid)

{
  bool bVar1;
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  unique_lock<std::recursive_mutex> local_78;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl._0_1_ =
       (byte)((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22) & 1;
  inline_assertion_check<true,bool>
            ((bool *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x11fe,"GetKey","IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)");
  GetAllScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_68,this);
  bVar3 = (_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left ==
          &local_68._M_impl.super__Rb_tree_header;
  p_Var2 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (bVar3) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_68);
LAB_00174ac1:
      (__return_storage_ptr__->super__Optional_base<CKey,_false,_false>)._M_payload.
      super__Optional_payload<CKey,_true,_false,_false>.super__Optional_payload_base<CKey>.
      _M_engaged = false;
LAB_00174ac5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    if (*(long *)(p_Var2 + 1) == 0) {
      this_00 = (DescriptorScriptPubKeyMan *)0x0;
    }
    else {
      this_00 = (DescriptorScriptPubKeyMan *)
                __dynamic_cast(*(long *)(p_Var2 + 1),&ScriptPubKeyMan::typeinfo,
                               &DescriptorScriptPubKeyMan::typeinfo,0);
    }
    if (this_00 == (DescriptorScriptPubKeyMan *)0x0) {
      __assert_fail("desc_spkm",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x1202,"std::optional<CKey> wallet::CWallet::GetKey(const CKeyID &) const");
    }
    local_78._M_device = &(this_00->cs_desc_man).super_recursive_mutex;
    local_78._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_78);
    DescriptorScriptPubKeyMan::GetKey(__return_storage_ptr__,this_00,keyid);
    bVar1 = (__return_storage_ptr__->super__Optional_base<CKey,_false,_false>)._M_payload.
            super__Optional_payload<CKey,_true,_false,_false>.super__Optional_payload_base<CKey>.
            _M_engaged;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
    if (bVar1 != false) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_68);
      if (bVar3) goto LAB_00174ac1;
      goto LAB_00174ac5;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    bVar3 = (_Rb_tree_header *)p_Var2 == &local_68._M_impl.super__Rb_tree_header;
  } while( true );
}

Assistant:

std::optional<CKey> CWallet::GetKey(const CKeyID& keyid) const
{
    Assert(IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    for (const auto& spkm : GetAllScriptPubKeyMans()) {
        const DescriptorScriptPubKeyMan* desc_spkm = dynamic_cast<DescriptorScriptPubKeyMan*>(spkm);
        assert(desc_spkm);
        LOCK(desc_spkm->cs_desc_man);
        if (std::optional<CKey> key = desc_spkm->GetKey(keyid)) {
            return key;
        }
    }
    return std::nullopt;
}